

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_archive.cpp
# Opt level: O2

int __thiscall ON_BinaryArchive::Read3dmGroup(ON_BinaryArchive *this,ON_Group **ppGroup)

{
  bool bVar1;
  int iVar2;
  ON_ModelComponent *model_component;
  ON__UINT32 tcode;
  ON_Object *p;
  ON__INT64 big_value;
  uint local_2c;
  ON_Object *local_28;
  ON__INT64 local_20;
  
  bVar1 = Read3dmTableRecord(this,group_table,ppGroup);
  if (!bVar1) {
    return 0;
  }
  local_2c = 0;
  local_20 = 0;
  bVar1 = BeginRead3dmBigChunk(this,&local_2c,&local_20);
  if (!bVar1) {
    model_component = (ON_ModelComponent *)0x0;
    goto LAB_003d0574;
  }
  if (local_2c == 0xffffffff) {
    model_component = (ON_ModelComponent *)0x0;
  }
  else {
    if (local_2c == 0x20008073) {
      Internal_Increment3dmTableItemCount(this);
      local_28 = (ON_Object *)0x0;
      iVar2 = ReadObject(this,&local_28);
      if (iVar2 != 0) {
        model_component = &ON_Group::Cast(local_28)->super_ON_ModelComponent;
        if (model_component != (ON_ModelComponent *)0x0) {
          Internal_Read3dmUpdateManifest(this,model_component);
          goto LAB_003d056c;
        }
        if (local_28 != (ON_Object *)0x0) {
          (*local_28->_vptr_ON_Object[4])();
        }
      }
      iVar2 = 0x28dc;
    }
    else {
      iVar2 = 0x28e0;
    }
    model_component = (ON_ModelComponent *)0x0;
    ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_archive.cpp"
               ,iVar2,"","ON_BinaryArchive::Read3dmGroup() - corrupt group table");
  }
LAB_003d056c:
  EndRead3dmChunk(this);
LAB_003d0574:
  *ppGroup = (ON_Group *)model_component;
  return (uint)(model_component != (ON_ModelComponent *)0x0);
}

Assistant:

int ON_BinaryArchive::Read3dmGroup( ON_Group** ppGroup )
{
  if ( false == Read3dmTableRecord(ON_3dmArchiveTableType::group_table, (void**)ppGroup))
    return 0;

  ON__UINT32 tcode = 0;
  ON__INT64 big_value = 0;
  ON_Group* group = nullptr;
  if ( BeginRead3dmBigChunk( &tcode, &big_value ) ) 
  {
    if ( tcode == TCODE_GROUP_RECORD ) 
    {
     Internal_Increment3dmTableItemCount();
      ON_Object* p = 0;
      if ( ReadObject( &p ) ) {
        group = ON_Group::Cast(p);
        if (!group)
          delete p;
        else
          Internal_Read3dmUpdateManifest(*group);
      }
      if (!group) {
        ON_ERROR("ON_BinaryArchive::Read3dmGroup() - corrupt group table");
      }
    }
    else if ( tcode != TCODE_ENDOFTABLE ) {
      ON_ERROR("ON_BinaryArchive::Read3dmGroup() - corrupt group table");
    }
    EndRead3dmChunk();
  }
  *ppGroup = group;
  return (group) ? 1 : 0;
}